

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_access_block_grid_idx(Integer g_a,Integer *subscript,AccessIndex *index,Integer *ld)

{
  long icode;
  uint uVar1;
  int iVar2;
  Integer IVar3;
  SingleComplex **ppSVar4;
  long lVar5;
  ulong uVar6;
  DoubleComplex *pDVar7;
  ulong uVar8;
  char *ptr;
  ulong local_38;
  
  uVar1._0_2_ = GA[g_a + 1000].ndim;
  uVar1._2_2_ = GA[g_a + 1000].irreg;
  uVar8 = 0;
  uVar6 = (ulong)uVar1;
  if ((short)(undefined2)uVar1 < 1) {
    uVar6 = uVar8;
  }
  icode = g_a + 1000;
  for (; (uVar6 & 0xffff) != uVar8; uVar8 = uVar8 + 1) {
    lVar5 = subscript[uVar8];
    if ((lVar5 < 0) || (GA[g_a + 1000].num_blocks[uVar8] <= lVar5)) {
      pnga_error("index outside allowed values",lVar5);
    }
  }
  pnga_access_block_grid_ptr(g_a,subscript,&local_38,ld);
  iVar2 = GA[icode].elemsize;
  IVar3 = pnga_type_c2f((long)GA[icode].type);
  switch(IVar3) {
  case 0x3f2:
    ppSVar4 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar7 = (DoubleComplex *)0x0;
    goto LAB_0016783b;
  case 0x3f4:
    lVar5 = (long)(local_38 - (long)FLT_MB) >> 2;
    pDVar7 = (DoubleComplex *)FLT_MB;
    goto LAB_00167834;
  case 0x3f5:
    ppSVar4 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar4 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar5 = (long)(local_38 - (long)DCPL_MB) >> 4;
    pDVar7 = DCPL_MB;
    goto LAB_00167834;
  }
  pDVar7 = (DoubleComplex *)*ppSVar4;
  lVar5 = (long)(local_38 - (long)pDVar7) >> 3;
LAB_00167834:
  *index = lVar5;
LAB_0016783b:
  uVar6 = local_38 % (ulong)(long)iVar2;
  uVar8 = (ulong)pDVar7 % (ulong)(long)iVar2;
  if (uVar6 != uVar8) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,local_38,uVar6,pDVar7,uVar8);
    pnga_error("nga_access: MA addressing problem: base address misallignment",icode);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_block_grid_idx(Integer g_a, Integer* subscript,
                                AccessIndex *index, Integer *ld)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i,ndim/*,p_handle*/;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/
   ndim = GA[handle].ndim;
   for (i=0; i<ndim; i++) 
     if (subscript[i]<0 || subscript[i] >= GA[handle].num_blocks[i]) 
       pnga_error("index outside allowed values",subscript[i]);

   pnga_access_block_grid_ptr(g_a,subscript,&ptr,ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}